

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::generate_mipmaps
          (mipmapped_texture *this,generate_mipmap_params *params,bool force)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  component_flags new_flags;
  orientation_flags_t orient_flags;
  vector<crnlib::mip_level_*> *pvVar7;
  mip_level *pmVar8;
  mip_level **ppmVar9;
  image_u8 *this_00;
  mip_level *this_01;
  image<crnlib::color_quad<unsigned_char,_int>_> *p;
  crnlib *this_02;
  uint local_e0;
  uint local_dc;
  uint l_2;
  uint f_2;
  resample_params rparams;
  image_u8 *pMip;
  uint mip_height;
  uint mip_width;
  uint l_1;
  image_u8 *pImg;
  image_u8 tmp;
  uint local_58;
  uint f_1;
  uint l;
  uint local_44;
  undefined1 local_40 [4];
  uint f;
  face_vec faces;
  uint height;
  uint width;
  uint num_levels;
  bool force_local;
  generate_mipmap_params *params_local;
  mipmapped_texture *this_local;
  
  bVar2 = is_valid(this);
  if (bVar2) {
    height = 1;
    faces.m_capacity = get_width(this);
    faces.m_size = get_height(this);
    while( true ) {
      bVar2 = true;
      if (faces.m_capacity <= params->m_min_mip_size) {
        bVar2 = params->m_min_mip_size < faces.m_size;
      }
      if (!bVar2) break;
      faces.m_capacity = faces.m_capacity >> 1;
      faces.m_size = faces.m_size >> 1;
      height = height + 1;
    }
    if ((params->m_max_mips != 0) && (params->m_max_mips < height)) {
      height = params->m_max_mips;
    }
    if (force) {
      uVar3 = get_num_levels(this);
      if (1 < uVar3) {
        discard_mipmaps(this);
      }
    }
    uVar3 = get_num_levels(this);
    if (height == uVar3) {
      this_local._7_1_ = 1;
    }
    else {
      uVar3 = get_num_faces(this);
      vector<crnlib::vector<crnlib::mip_level_*>_>::vector
                ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40,uVar3);
      local_44 = 0;
      while( true ) {
        uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                          ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40);
        if (uVar3 <= local_44) break;
        pvVar7 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                           ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40,local_44);
        vector<crnlib::mip_level_*>::resize(pvVar7,height,false);
        for (local_58 = 0; local_58 < height; local_58 = local_58 + 1) {
          pmVar8 = crnlib_new<crnlib::mip_level>();
          pvVar7 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40,local_44);
          ppmVar9 = vector<crnlib::mip_level_*>::operator[](pvVar7,local_58);
          *ppmVar9 = pmVar8;
        }
        local_44 = local_44 + 1;
      }
      tmp.m_pixel_buf.m_capacity = 0;
      while( true ) {
        uVar3 = tmp.m_pixel_buf.m_capacity;
        uVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                          ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40);
        if (uVar4 <= uVar3) break;
        image<crnlib::color_quad<unsigned_char,_int>_>::image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
        pmVar8 = get_level(this,tmp.m_pixel_buf.m_capacity,0);
        this_00 = mip_level::get_unpacked_image(pmVar8,(image_u8 *)&pImg,1);
        for (mip_height = 0; mip_height < height; mip_height = mip_height + 1) {
          uVar3 = get_width(this);
          uVar5 = math::maximum<unsigned_int>(1,uVar3 >> ((byte)mip_height & 0x1f));
          uVar3 = get_height(this);
          this_02 = (crnlib *)0x1;
          uVar6 = math::maximum<unsigned_int>(1,uVar3 >> ((byte)mip_height & 0x1f));
          rparams._32_8_ = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>(this_02)
          ;
          if (mip_height != 0) {
            image_utils::resample_params::resample_params((resample_params *)&l_2);
            rparams.m_pFilter._0_4_ = (params->super_resample_params).m_filter_scale;
            rparams.m_filter_scale = 0.0;
            l_2 = uVar5;
            f_2 = uVar6;
            bVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid(this_00,3);
            rparams._20_4_ = bVar2 + 3;
            rparams.m_pFilter._4_1_ = (params->super_resample_params).m_srgb & 1;
            rparams.m_pFilter._5_1_ = (params->super_resample_params).m_wrapping & 1;
            rparams._0_8_ = (params->super_resample_params).m_pFilter;
            rparams.m_num_comps._0_1_ = (params->super_resample_params).m_multithreaded & 1;
            p = (image<crnlib::color_quad<unsigned_char,_int>_> *)rparams._32_8_;
            bVar2 = image_utils::resample
                              (this_00,(image_u8 *)rparams._32_8_,(resample_params *)&l_2);
            if (bVar2) {
              if (((params->super_resample_params).m_renormalize & 1U) != 0) {
                image_utils::renorm_normal_map((image_u8 *)rparams._32_8_);
              }
              uVar1 = rparams._32_8_;
              new_flags = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(this_00);
              image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)uVar1,new_flags);
              goto LAB_0015001f;
            }
            crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                      ((crnlib *)rparams._32_8_,p);
            local_dc = 0;
            while( true ) {
              uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                                ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40);
              if (uVar3 <= local_dc) break;
              local_e0 = 0;
              while( true ) {
                pvVar7 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                                   ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40,
                                    local_dc);
                uVar3 = vector<crnlib::mip_level_*>::size(pvVar7);
                if (uVar3 <= local_e0) break;
                pvVar7 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                                   ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40,
                                    local_dc);
                ppmVar9 = vector<crnlib::mip_level_*>::operator[](pvVar7,local_e0);
                crnlib_delete<crnlib::mip_level>(*ppmVar9);
                local_e0 = local_e0 + 1;
              }
              local_dc = local_dc + 1;
            }
            this_local._7_1_ = 0;
            bVar2 = true;
            goto LAB_001500d9;
          }
          image<crnlib::color_quad<unsigned_char,_int>_>::operator=
                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)rparams._32_8_,this_00);
LAB_0015001f:
          pvVar7 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40,
                              tmp.m_pixel_buf.m_capacity);
          ppmVar9 = vector<crnlib::mip_level_*>::operator[](pvVar7,mip_height);
          uVar1 = rparams._32_8_;
          pmVar8 = *ppmVar9;
          this_01 = get_level(this,tmp.m_pixel_buf.m_capacity,0);
          orient_flags = mip_level::get_orientation_flags(this_01);
          mip_level::assign(pmVar8,(image_u8 *)uVar1,PIXEL_FMT_INVALID,orient_flags);
        }
        bVar2 = false;
LAB_001500d9:
        image<crnlib::color_quad<unsigned_char,_int>_>::~image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
        if (bVar2) goto LAB_00150121;
        tmp.m_pixel_buf.m_capacity = tmp.m_pixel_buf.m_capacity + 1;
      }
      assign(this,(face_vec *)local_40);
      this_local._7_1_ = 1;
LAB_00150121:
      vector<crnlib::vector<crnlib::mip_level_*>_>::~vector
                ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_40);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool mipmapped_texture::generate_mipmaps(const generate_mipmap_params& params, bool force) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  uint num_levels = 1;
  {
    uint width = get_width();
    uint height = get_height();
    while ((width > params.m_min_mip_size) || (height > params.m_min_mip_size)) {
      width >>= 1U;
      height >>= 1U;
      num_levels++;
    }
  }

  if ((params.m_max_mips > 0) && (num_levels > params.m_max_mips))
    num_levels = params.m_max_mips;

  if ((force) && (get_num_levels() > 1))
    discard_mipmaps();

  if (num_levels == get_num_levels())
    return true;

  face_vec faces(get_num_faces());
  for (uint f = 0; f < faces.size(); f++) {
    faces[f].resize(num_levels);
    for (uint l = 0; l < num_levels; l++)
      faces[f][l] = crnlib_new<mip_level>();
  }

  for (uint f = 0; f < faces.size(); f++) {
    image_u8 tmp;
    image_u8* pImg = get_level(f, 0)->get_unpacked_image(tmp, cUnpackFlagUncook);

    for (uint l = 0; l < num_levels; l++) {
      const uint mip_width = math::maximum<uint>(1U, get_width() >> l);
      const uint mip_height = math::maximum<uint>(1U, get_height() >> l);

      image_u8* pMip = crnlib_new<image_u8>();

      if (!l)
        *pMip = *pImg;
      else {
        image_utils::resample_params rparams;
        rparams.m_dst_width = mip_width;
        rparams.m_dst_height = mip_height;
        rparams.m_filter_scale = params.m_filter_scale;
        rparams.m_first_comp = 0;
        rparams.m_num_comps = pImg->is_component_valid(3) ? 4 : 3;
        rparams.m_srgb = params.m_srgb;
        rparams.m_wrapping = params.m_wrapping;
        rparams.m_pFilter = params.m_pFilter;
        rparams.m_multithreaded = params.m_multithreaded;

        if (!image_utils::resample(*pImg, *pMip, rparams)) {
          crnlib_delete(pMip);

          for (uint f = 0; f < faces.size(); f++)
            for (uint l = 0; l < faces[f].size(); l++)
              crnlib_delete(faces[f][l]);

          return false;
        }

        if (params.m_renormalize)
          image_utils::renorm_normal_map(*pMip);

        pMip->set_comp_flags(pImg->get_comp_flags());
      }

      faces[f][l]->assign(pMip, PIXEL_FMT_INVALID, get_level(f, 0)->get_orientation_flags());
    }
  }

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}